

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QString * QTimeZonePrivate::isoOffsetFormat
                    (QString *__return_storage_ptr__,int offsetFromUtc,NameType mode)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (offsetFromUtc == 0 && (mode ^ ShortName) == DefaultName) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      utcQString();
      return __return_storage_ptr__;
    }
  }
  else {
    uVar2 = (ulong)(uint)-offsetFromUtc;
    if (0 < offsetFromUtc) {
      uVar2 = (ulong)(uint)offsetFromUtc;
    }
    uVar1 = (uVar2 / 0x3c) % 0x3c;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
    QString::asprintf((char **)__return_storage_ptr__,"UTC%c%02d",
                      (ulong)((offsetFromUtc >> 0x1f) * -2 + 0x2b),uVar2 / 0xe10);
    iVar3 = (int)(uVar2 % 0x3c);
    if ((mode ^ ShortName) != DefaultName || ((int)uVar1 != 0 || iVar3 != 0)) {
      QString::asprintf((char **)&QStack_48,":%02d",uVar1);
      QString::append(__return_storage_ptr__,(QString *)&QStack_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    }
    if (mode == LongName || iVar3 != 0) {
      QString::asprintf((char **)&QStack_48,":%02d",uVar2 % 0x3c);
      QString::append(__return_storage_ptr__,(QString *)&QStack_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QTimeZonePrivate::isoOffsetFormat(int offsetFromUtc, QTimeZone::NameType mode)
{
    if (mode == QTimeZone::ShortName && !offsetFromUtc)
        return utcQString();

    char sign = '+';
    if (offsetFromUtc < 0) {
        sign = '-';
        offsetFromUtc = -offsetFromUtc;
    }
    const int secs = offsetFromUtc % 60;
    const int mins = (offsetFromUtc / 60) % 60;
    const int hour = offsetFromUtc / 3600;
    QString result = QString::asprintf("UTC%c%02d", sign, hour);
    if (mode != QTimeZone::ShortName || secs || mins)
        result += QString::asprintf(":%02d", mins);
    if (mode == QTimeZone::LongName || secs)
        result += QString::asprintf(":%02d", secs);
    return result;
}